

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall kratos::VarFanOutVisitor::visit(VarFanOutVisitor *this,Generator *generator)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer this_01;
  bool bVar1;
  VarType VVar2;
  size_type sVar3;
  reference pvVar4;
  element_type *peVar5;
  iterator __first;
  iterator __last;
  element_type *peVar6;
  element_type *var_00;
  element_type *new_var;
  shared_ptr<kratos::Stmt> local_138;
  int local_124;
  undefined1 local_120 [8];
  shared_ptr<kratos::AssignStmt> stmt_1;
  shared_ptr<kratos::Var> dst;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  shared_ptr<kratos::Var> next;
  type *stmt;
  type *pre;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  uint64_t i;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  debug_info;
  undefined1 local_88 [8];
  vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
  chain;
  undefined1 local_60 [8];
  shared_ptr<kratos::Var> var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_name;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_names;
  Generator *generator_local;
  VarFanOutVisitor *this_local;
  
  var_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)generator;
  Generator::get_all_var_names_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2,generator);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
  var_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&var_name), bVar1) {
    var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end2);
    Generator::get_var((Generator *)local_60,
                       var_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
    ::vector((vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
              *)local_88);
    compute_assign_chain
              ((shared_ptr<kratos::Var> *)local_60,
               (vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                *)local_88);
    sVar3 = std::
            vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
            ::size((vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                    *)local_88);
    if (sVar3 < 3) {
      debug_info.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
    }
    else {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)&i);
      for (local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          sVar3 = std::
                  vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                  ::size((vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                          *)local_88),
          local_b0._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar3 - 1);
          local_b0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(local_b0._M_pi)->_vptr__Sp_counted_base + 1)) {
        pvVar4 = std::
                 vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                 ::operator[]((vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                               *)local_88,(size_type)local_b0._M_pi);
        std::get<0ul,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>(pvVar4);
        next.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::get<1ul,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>(pvVar4);
        pvVar4 = std::
                 vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                 ::operator[]((vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                               *)local_88,
                              (size_type)((long)&(local_b0._M_pi)->_vptr__Sp_counted_base + 1));
        std::shared_ptr<kratos::Var>::shared_ptr((shared_ptr<kratos::Var> *)local_d8,&pvVar4->first)
        ;
        if ((var_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage[5].field_2._M_local_buf[0xc] & 1U)
            != 0) {
          local_e8._0_8_ =
               std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&i);
          __gnu_cxx::
          __normal_iterator<std::pair<std::__cxx11::string,unsigned_int>const*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>
          ::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*>
                    ((__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>const*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>
                      *)(local_e8 + 8),
                     (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                      *)local_e8);
          peVar5 = std::
                   __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)next.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
          __first = std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::begin(&(peVar5->super_Stmt).super_IRNode.fn_name_ln);
          peVar5 = std::
                   __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)next.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
          __last = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::end(&(peVar5->super_Stmt).super_IRNode.fn_name_ln);
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)&i,(const_iterator)local_e8._8_8_,
                     (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                      )__first._M_current,
                     (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                      )__last._M_current);
        }
        peVar6 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d8);
        Var::unassign(peVar6,(shared_ptr<kratos::AssignStmt> *)
                             next.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
        std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_d8);
      }
      pvVar4 = std::
               vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
               ::back((vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                       *)local_88);
      this_00 = &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      std::shared_ptr<kratos::Var>::shared_ptr((shared_ptr<kratos::Var> *)this_00,&pvVar4->first);
      var_00 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_60);
      new_var = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)this_00);
      Var::move_src_to(var_00,new_var,
                       (Generator *)
                       var_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      peVar6 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_60);
      VVar2 = Var::type(peVar6);
      if (VVar2 == PortIO) {
        peVar6 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stmt_1.
                                super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        VVar2 = Var::type(peVar6);
        if (VVar2 == PortIO) {
          peVar6 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&stmt_1.
                                  super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
          Var::assign((Var *)local_120,(shared_ptr<kratos::Var> *)peVar6,(AssignmentType)local_60);
          if ((var_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[5].field_2._M_local_buf[0xc] & 1U)
              != 0) {
            peVar5 = std::
                     __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_120);
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::operator=(&(peVar5->super_Stmt).super_IRNode.fn_name_ln,
                        (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&i);
            peVar5 = std::
                     __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_120);
            local_124 = 0xee;
            std::
            vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
            ::emplace_back<char_const(&)[81],int>
                      ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                        *)&(peVar5->super_Stmt).super_IRNode.fn_name_ln,
                       (char (*) [81])
                       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc"
                       ,&local_124);
          }
          this_01 = var_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                    (&local_138,(shared_ptr<kratos::AssignStmt> *)local_120);
          Generator::add_stmt((Generator *)this_01,&local_138);
          std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_138);
          std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                    ((shared_ptr<kratos::AssignStmt> *)local_120);
        }
      }
      std::shared_ptr<kratos::Var>::~shared_ptr
                ((shared_ptr<kratos::Var> *)
                 &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)&i);
      debug_info.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    std::
    vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
    ::~vector((vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
               *)local_88);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_60);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range2);
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto var_names = generator->get_all_var_names();
        for (auto const& var_name : var_names) {
            auto var = generator->get_var(var_name);
            std::vector<std::pair<std::shared_ptr<Var>, std::shared_ptr<AssignStmt>>> chain;
            compute_assign_chain(var, chain);
            if (chain.size() <= 2) continue;  // nothing to be done

            std::vector<std::pair<std::string, uint32_t>> debug_info;

            for (uint64_t i = 0; i < chain.size() - 1; i++) {
                auto& [pre, stmt] = chain[i];
                auto next = chain[i + 1].first;

                // insert debug info
                if (generator->debug) {
                    debug_info.insert(debug_info.end(), stmt->fn_name_ln.begin(),
                                      stmt->fn_name_ln.end());
                }

                next->unassign(stmt);
            }

            auto dst = chain.back().first;
            Var::move_src_to(var.get(), dst.get(), generator, false);
            // if both of them are ports, we need to add a statement
            if (var->type() == VarType::PortIO && dst->type() == VarType::PortIO) {
                // need to add a top assign statement
                auto stmt = dst->assign(var, AssignmentType::Blocking);
                if (generator->debug) {
                    // copy every vars definition over
                    stmt->fn_name_ln = debug_info;
                    stmt->fn_name_ln.emplace_back(__FILE__, __LINE__);
                }
                generator->add_stmt(stmt);
            }
        }
    }